

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O3

void default_finalize_send_packet
               (quicly_crypto_engine_t *engine,quicly_conn_t *conn,
               ptls_cipher_context_t *header_protect_ctx,ptls_aead_context_t *packet_protect_ctx,
               ptls_iovec_t datagram,size_t first_byte_at,size_t payload_from,uint64_t packet_number
               ,int coalesced)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  ptls_aead_supplementary_encryption_t supp;
  
  puVar2 = datagram.base;
  puVar1 = puVar2 + payload_from + 2;
  supp.output[0] = '\0';
  supp.output[1] = '\0';
  supp.output[2] = '\0';
  supp.output[3] = '\0';
  supp.output[4] = '\0';
  supp.output[5] = '\0';
  supp.output[6] = '\0';
  supp.output[7] = '\0';
  supp.output[8] = '\0';
  supp.output[9] = '\0';
  supp.output[10] = '\0';
  supp.output[0xb] = '\0';
  supp.output[0xc] = '\0';
  supp.output[0xd] = '\0';
  supp.output[0xe] = '\0';
  supp.output[0xf] = '\0';
  supp.ctx = header_protect_ctx;
  supp.input = puVar1;
  (*packet_protect_ctx->do_encrypt)
            (packet_protect_ctx,puVar2 + payload_from,puVar2 + payload_from,
             datagram.len - (packet_protect_ctx->algo->tag_size + payload_from),packet_number,
             puVar2 + first_byte_at,payload_from - first_byte_at,&supp);
  puVar2[first_byte_at] =
       ((byte)~puVar2[first_byte_at] >> 3 | 0xf) & supp.output[0] ^ puVar2[first_byte_at];
  *(ushort *)(puVar1 + -4) = *(ushort *)(puVar1 + -4) ^ supp.output._1_2_;
  return;
}

Assistant:

static void default_finalize_send_packet(quicly_crypto_engine_t *engine, quicly_conn_t *conn,
                                         ptls_cipher_context_t *header_protect_ctx, ptls_aead_context_t *packet_protect_ctx,
                                         ptls_iovec_t datagram, size_t first_byte_at, size_t payload_from, uint64_t packet_number,
                                         int coalesced)
{
    ptls_aead_supplementary_encryption_t supp = {.ctx = header_protect_ctx,
                                                 .input = datagram.base + payload_from - QUICLY_SEND_PN_SIZE + QUICLY_MAX_PN_SIZE};

    ptls_aead_encrypt_s(packet_protect_ctx, datagram.base + payload_from, datagram.base + payload_from,
                        datagram.len - payload_from - packet_protect_ctx->algo->tag_size, packet_number,
                        datagram.base + first_byte_at, payload_from - first_byte_at, &supp);

    datagram.base[first_byte_at] ^= supp.output[0] & (QUICLY_PACKET_IS_LONG_HEADER(datagram.base[first_byte_at]) ? 0xf : 0x1f);
    for (size_t i = 0; i != QUICLY_SEND_PN_SIZE; ++i)
        datagram.base[payload_from + i - QUICLY_SEND_PN_SIZE] ^= supp.output[i + 1];
}